

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O1

void cpp_wrapper_static_open_close_complex
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value)

{
  int key_00;
  int value_00;
  int key_01;
  int expected_value;
  ion_dictionary_id_t iVar1;
  int32_t actual;
  int32_t actual_00;
  ion_dictionary_size_t iVar2;
  ion_dictionary_type_t iVar3;
  ion_dictionary_parent_t *piVar4;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t config_00;
  ion_dictionary_config_info_t config_01;
  ion_dictionary_config_info_t config_02;
  ion_dictionary_config_info_t config_03;
  ion_dictionary_config_info_t config_04;
  ion_dictionary_config_info_t config_05;
  ion_dictionary_config_info_t config_06;
  ion_dictionary_config_info_t config_07;
  ion_dictionary_config_info_t config_08;
  ion_dictionary_config_info_t config_09;
  ion_dictionary_config_info_t config_10;
  ion_dictionary_config_info_t config_11;
  ion_dictionary_config_info_t config_12;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  ion_err_t iVar34;
  planck_unit_result_t pVar35;
  undefined2 uStack_83;
  undefined1 uStack_81;
  undefined2 uStack_6b;
  undefined1 uStack_69;
  undefined2 local_66;
  undefined1 local_64;
  undefined2 local_63;
  undefined1 local_61;
  
  piVar4 = (dict->dict).instance;
  iVar1 = piVar4->id;
  actual = (piVar4->record).key_size;
  uVar32 = piVar4->key_type;
  uVar33 = (piVar4->record).key_size;
  config_12.key_size = uVar33;
  config_12.type = uVar32;
  uVar30 = piVar4->key_type;
  uVar31 = (piVar4->record).key_size;
  config_11.key_size = uVar31;
  config_11.type = uVar30;
  uVar28 = piVar4->key_type;
  uVar29 = (piVar4->record).key_size;
  config_10.key_size = uVar29;
  config_10.type = uVar28;
  uVar26 = piVar4->key_type;
  uVar27 = (piVar4->record).key_size;
  config_09.key_size = uVar27;
  config_09.type = uVar26;
  uVar24 = piVar4->key_type;
  uVar25 = (piVar4->record).key_size;
  config_08.key_size = uVar25;
  config_08.type = uVar24;
  uVar22 = piVar4->key_type;
  uVar23 = (piVar4->record).key_size;
  config_07.key_size = uVar23;
  config_07.type = uVar22;
  uVar20 = piVar4->key_type;
  uVar21 = (piVar4->record).key_size;
  config_06.key_size = uVar21;
  config_06.type = uVar20;
  uVar18 = piVar4->key_type;
  uVar19 = (piVar4->record).key_size;
  config_05.key_size = uVar19;
  config_05.type = uVar18;
  uVar16 = piVar4->key_type;
  uVar17 = (piVar4->record).key_size;
  config_04.key_size = uVar17;
  config_04.type = uVar16;
  uVar14 = piVar4->key_type;
  uVar15 = (piVar4->record).key_size;
  config_03.key_size = uVar15;
  config_03.type = uVar14;
  uVar12 = piVar4->key_type;
  uVar13 = (piVar4->record).key_size;
  config_02.key_size = uVar13;
  config_02.type = uVar12;
  uVar10 = piVar4->key_type;
  uVar11 = (piVar4->record).key_size;
  config_01.key_size = uVar11;
  config_01.type = uVar10;
  uVar8 = piVar4->key_type;
  uVar9 = (piVar4->record).key_size;
  config_00.key_size = uVar9;
  config_00.type = uVar8;
  uVar6 = piVar4->key_type;
  uVar7 = (piVar4->record).key_size;
  config.key_size = uVar7;
  config.type = uVar6;
  actual_00 = (piVar4->record).value_size;
  iVar2 = dict->dict_size;
  iVar3 = piVar4->type;
  cpp_wrapper_insert(tc,dict,key,value,'\0');
  key_00 = key + 10;
  value_00 = value + 10;
  cpp_wrapper_insert(tc,dict,key_00,value_00,'\0');
  cpp_wrapper_get(tc,dict,key,value,'\0',1);
  cpp_wrapper_get(tc,dict,key_00,value_00,'\0',1);
  key_01 = key + -10;
  expected_value = value + -10;
  cpp_wrapper_get(tc,dict,key_01,expected_value,'\x01',0);
  iVar34 = dictionary_close(&dict->dict);
  (dict->last_status).error = iVar34;
  pVar35 = planck_unit_assert_int_are_equal
                     (tc,0,(int)iVar34,0x9a,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                     );
  if (pVar35 != '\0') {
    switch(iVar3) {
    case dictionary_type_bpp_tree_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config.dictionary_size = iVar2;
      config.value_size = actual_00;
      lVar5 = (ulong)CONCAT12(uStack_69,uStack_6b) << 0x28;
      config._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config.id = iVar1;
      config.dictionary_type = (int)lVar5;
      config.dictionary_status = (char)((ulong)lVar5 >> 0x20);
      config._29_3_ = (int3)((ulong)lVar5 >> 0x28);
      BppTree<int,_int>::BppTree((BppTree<int,_int> *)dict,config);
      break;
    case dictionary_type_flat_file_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_03.dictionary_size = iVar2;
      config_03.value_size = actual_00;
      config_03._29_2_ = uStack_6b;
      config_03.dictionary_type = dictionary_type_flat_file_t;
      config_03.dictionary_status = '\0';
      config_03._31_1_ = uStack_69;
      config_03._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_03.id = iVar1;
      FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)dict,config_03);
      break;
    case dictionary_type_open_address_file_hash_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_01.dictionary_size = iVar2;
      config_01.value_size = actual_00;
      config_01._29_2_ = uStack_6b;
      config_01.dictionary_type = dictionary_type_open_address_file_hash_t;
      config_01.dictionary_status = '\0';
      config_01._31_1_ = uStack_69;
      config_01._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_01.id = iVar1;
      OpenAddressFileHash<int,_int>::OpenAddressFileHash
                ((OpenAddressFileHash<int,_int> *)dict,config_01);
      break;
    case dictionary_type_open_address_hash_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_02.dictionary_size = iVar2;
      config_02.value_size = actual_00;
      config_02._29_2_ = uStack_6b;
      config_02.dictionary_type = dictionary_type_open_address_hash_t;
      config_02.dictionary_status = '\0';
      config_02._31_1_ = uStack_69;
      config_02._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_02.id = iVar1;
      OpenAddressHash<int,_int>::OpenAddressHash((OpenAddressHash<int,_int> *)dict,config_02);
      break;
    case dictionary_type_skip_list_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_00.dictionary_size = iVar2;
      config_00.value_size = actual_00;
      config_00._29_2_ = uStack_6b;
      config_00.dictionary_type = dictionary_type_skip_list_t;
      config_00.dictionary_status = '\0';
      config_00._31_1_ = uStack_69;
      config_00._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_00.id = iVar1;
      SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_00);
      break;
    case dictionary_type_linear_hash_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_04.dictionary_size = iVar2;
      config_04.value_size = actual_00;
      config_04._29_2_ = uStack_6b;
      config_04.dictionary_type = dictionary_type_linear_hash_t;
      config_04.dictionary_status = '\0';
      config_04._31_1_ = uStack_69;
      config_04._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_04.id = iVar1;
      LinearHash<int,_int>::LinearHash((LinearHash<int,_int> *)dict,config_04);
      break;
    case dictionary_type_error_t:
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_05.dictionary_size = iVar2;
      config_05.value_size = actual_00;
      config_05._29_2_ = uStack_6b;
      config_05.dictionary_type = dictionary_type_error_t;
      config_05.dictionary_status = '\0';
      config_05._31_1_ = uStack_69;
      config_05._4_4_ = (int)(((ulong)CONCAT12(uStack_81,uStack_83) << 0x28) >> 0x20);
      config_05.id = iVar1;
      SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_05);
      (dict->last_status).error = '\x12';
    }
    pVar35 = planck_unit_assert_int_are_equal
                       (tc,0,(int)(dict->last_status).error,200,
                        "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                       );
    if (((pVar35 != '\0') &&
        (pVar35 = planck_unit_assert_int_are_equal
                            (tc,(((dict->dict).instance)->record).key_size,actual,0xc9,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                            ), pVar35 != '\0')) &&
       (pVar35 = planck_unit_assert_int_are_equal
                           (tc,(((dict->dict).instance)->record).value_size,actual_00,0xca,
                            "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                           ), pVar35 != '\0')) {
      cpp_wrapper_get(tc,dict,key,value,'\0',1);
      cpp_wrapper_get(tc,dict,key_00,value_00,'\0',1);
      cpp_wrapper_update(tc,dict,key,value + 1,'\0',1,'\x01');
      cpp_wrapper_update(tc,dict,key_01,expected_value,'\0',1,'\x01');
      iVar34 = dictionary_close(&dict->dict);
      (dict->last_status).error = iVar34;
      pVar35 = planck_unit_assert_int_are_equal
                         (tc,0,(int)iVar34,0xd9,
                          "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                         );
      if (pVar35 != '\0') {
        switch(iVar3) {
        case dictionary_type_bpp_tree_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_06.dictionary_size = iVar2;
          config_06.value_size = actual_00;
          lVar5 = (ulong)CONCAT12(local_64,local_66) << 0x28;
          config_06._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_06.id = iVar1;
          config_06.dictionary_type = (int)lVar5;
          config_06.dictionary_status = (char)((ulong)lVar5 >> 0x20);
          config_06._29_3_ = (int3)((ulong)lVar5 >> 0x28);
          BppTree<int,_int>::BppTree((BppTree<int,_int> *)dict,config_06);
          break;
        case dictionary_type_flat_file_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_10.dictionary_size = iVar2;
          config_10.value_size = actual_00;
          config_10._29_2_ = local_66;
          config_10.dictionary_type = dictionary_type_flat_file_t;
          config_10.dictionary_status = '\0';
          config_10._31_1_ = local_64;
          config_10._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_10.id = iVar1;
          FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)dict,config_10);
          break;
        case dictionary_type_open_address_file_hash_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_08.dictionary_size = iVar2;
          config_08.value_size = actual_00;
          config_08._29_2_ = local_66;
          config_08.dictionary_type = dictionary_type_open_address_file_hash_t;
          config_08.dictionary_status = '\0';
          config_08._31_1_ = local_64;
          config_08._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_08.id = iVar1;
          OpenAddressFileHash<int,_int>::OpenAddressFileHash
                    ((OpenAddressFileHash<int,_int> *)dict,config_08);
          break;
        case dictionary_type_open_address_hash_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_09.dictionary_size = iVar2;
          config_09.value_size = actual_00;
          config_09._29_2_ = local_66;
          config_09.dictionary_type = dictionary_type_open_address_hash_t;
          config_09.dictionary_status = '\0';
          config_09._31_1_ = local_64;
          config_09._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_09.id = iVar1;
          OpenAddressHash<int,_int>::OpenAddressHash((OpenAddressHash<int,_int> *)dict,config_09);
          break;
        case dictionary_type_skip_list_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_07.dictionary_size = iVar2;
          config_07.value_size = actual_00;
          config_07._29_2_ = local_66;
          config_07.dictionary_type = dictionary_type_skip_list_t;
          config_07.dictionary_status = '\0';
          config_07._31_1_ = local_64;
          config_07._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_07.id = iVar1;
          SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_07);
          break;
        case dictionary_type_linear_hash_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_11.dictionary_size = iVar2;
          config_11.value_size = actual_00;
          config_11._29_2_ = local_66;
          config_11.dictionary_type = dictionary_type_linear_hash_t;
          config_11.dictionary_status = '\0';
          config_11._31_1_ = local_64;
          config_11._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_11.id = iVar1;
          LinearHash<int,_int>::LinearHash((LinearHash<int,_int> *)dict,config_11);
          break;
        case dictionary_type_error_t:
          dict = (Dictionary<int,_int> *)operator_new(0x80);
          config_12.dictionary_size = iVar2;
          config_12.value_size = actual_00;
          config_12._29_2_ = local_66;
          config_12.dictionary_type = dictionary_type_error_t;
          config_12.dictionary_status = '\0';
          config_12._31_1_ = local_64;
          config_12._4_4_ = (int)(((ulong)CONCAT12(local_61,local_63) << 0x28) >> 0x20);
          config_12.id = iVar1;
          SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_12);
          (dict->last_status).error = '\x12';
        }
        pVar35 = planck_unit_assert_int_are_equal
                           (tc,0,(int)(dict->last_status).error,0x101,
                            "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                           );
        if (((pVar35 != '\0') &&
            (pVar35 = planck_unit_assert_int_are_equal
                                (tc,(((dict->dict).instance)->record).key_size,actual,0x102,
                                 "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                                ), pVar35 != '\0')) &&
           (pVar35 = planck_unit_assert_int_are_equal
                               (tc,(((dict->dict).instance)->record).value_size,actual_00,0x103,
                                "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                               ), pVar35 != '\0')) {
          cpp_wrapper_get(tc,dict,key,value + 1,'\0',1);
          cpp_wrapper_get(tc,dict,key_00,value_00,'\0',1);
          cpp_wrapper_get(tc,dict,key_01,expected_value,'\0',1);
          if (dict == (Dictionary<int,_int> *)0x0) {
            return;
          }
          iVar34 = dictionary_delete_dictionary(&dict->dict);
          (dict->last_status).error = iVar34;
          operator_delete(dict);
          return;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_static_open_close_complex(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int value
) {
	ion_err_t				error;
	ion_dictionary_id_t		gdict_id	= dict->dict.instance->id;
	ion_key_size_t			key_size	= dict->dict.instance->record.key_size;
	ion_value_size_t		val_size	= dict->dict.instance->record.value_size;
	ion_key_type_t			key_type	= dict->dict.instance->key_type;
	ion_dictionary_size_t	dict_size	= dict->dict_size;
	ion_dictionary_type_t	dict_type	= dict->dict.instance->type;

	/* Insert test records so we can check data integrity after we close/open */
	cpp_wrapper_insert(tc, dict, key, value, boolean_false);
	cpp_wrapper_insert(tc, dict, key + 10, value + 10, boolean_false);

	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);
	cpp_wrapper_get(tc, dict, key - 10, value - 10, err_item_not_found, 0);

	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	ion_dictionary_config_info_t config = {
		gdict_id, 0, key_type, key_size, val_size, dict_size, dict_type
	};

	int type = 0;

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);

	/* Update one test record */
	cpp_wrapper_update(tc, dict, key, value + 1, err_ok, 1, boolean_true);

	/* Try and update a record that does not exist. We expect an upsert to occur. */
	cpp_wrapper_update(tc, dict, key - 10, value - 10, err_ok, 1, boolean_true);

	/* Close dictionary again. */
	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test records. */
	/* Check the test records */
	cpp_wrapper_get(tc, dict, key, value + 1, err_ok, 1);
	cpp_wrapper_get(tc, dict, key + 10, value + 10, err_ok, 1);
	cpp_wrapper_get(tc, dict, key - 10, value - 10, err_ok, 1);

	delete dict;
}